

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,bool to_array,
          int cached_has_bits_index)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  FieldGenerator *pFVar4;
  long *plVar5;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field_00;
  _Alloc_hider _Var6;
  Hex hex;
  string mask;
  undefined1 local_80 [48];
  string local_50;
  
  field_00 = field;
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\0') {
    anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,field);
    field_00 = extraout_RDX;
  }
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\0') {
    if ((*(int *)(field + 0x4c) == 3) || (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3)
       ) {
      if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) goto LAB_0025f855;
      local_80._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_80 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"this->","");
      bVar2 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)local_80,field);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
      if (!bVar2) goto LAB_0025f9c7;
    }
    else {
      if (field[0x50] == (FieldDescriptor)0x0) {
        plVar5 = (long *)(*(long *)(field + 0x58) + 0x30);
      }
      else if (*(long *)(field + 0x68) == 0) {
        plVar5 = (long *)(*(long *)(field + 0x30) + 0x98);
      }
      else {
        plVar5 = (long *)(*(long *)(field + 0x68) + 0x80);
      }
      iVar1 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(int)((ulong)((long)field - *plVar5) >> 3) * 0x3cf3cf3d];
      iVar3 = iVar1 + 0x1f;
      if (-1 < iVar1) {
        iVar3 = iVar1;
      }
      if (iVar3 >> 5 == cached_has_bits_index) {
        hex.value = 1L << ((byte)iVar1 & 0x1f);
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_80,hex);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,local_80._0_8_,(char *)(local_80._0_8_ + local_80._8_8_));
        io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",&local_50);
        local_80._16_8_ = local_50.field_2._M_allocated_capacity;
        _Var6._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0025f97a:
          operator_delete(_Var6._M_p,local_80._16_8_ + 1);
        }
      }
      else {
        FieldName_abi_cxx11_((string *)local_80,(cpp *)field,field_00);
        io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)local_80);
        _Var6._M_p = (pointer)local_80._0_8_;
        if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) goto LAB_0025f97a;
      }
      io::Printer::Indent(printer);
      pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
LAB_0025f855:
    pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
  }
LAB_0025f9c7:
  io::Printer::Print(printer,"\n");
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field, bool to_array,
    int cached_has_bits_index) {
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(printer, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (!field->is_repeated() && HasFieldPresence(descriptor_->file())) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = has_bit_indices_[field->index()];
    if (cached_has_bits_index == has_bit_index / 32) {
      const string mask = StrCat(
          strings::Hex(1u << (has_bit_index % 32),
          strings::ZERO_PAD_8));

      printer->Print(
          "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
    } else {
      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    }

    printer->Indent();
    have_enclosing_if = true;
  } else if (!HasFieldPresence(descriptor_->file())) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  if (to_array) {
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
  } else {
    field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
  }

  if (have_enclosing_if) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
}